

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMVar1;
  void *pvVar2;
  JsonParse *pParse;
  byte *pbVar3;
  JsonNode *pJVar4;
  char *pcVar5;
  size_t sVar6;
  sqlite3_value **extraout_RDX;
  undefined8 extraout_RDX_00;
  sqlite3_value **extraout_RDX_01;
  sqlite3_value **extraout_RDX_02;
  sqlite3_value **extraout_RDX_03;
  sqlite3_value **extraout_RDX_04;
  sqlite3_value **aReplace;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  JsonString jx;
  JsonString local_b8;
  
  if (1 < argc) {
    pvVar2 = ctx->pFunc->pUserData;
    pParse = jsonParseCached(ctx,argv,ctx);
    if (pParse != (JsonParse *)0x0) {
      if (argc == 2) {
        pbVar3 = (byte *)sqlite3ValueText(argv[1],'\x01');
        if (pbVar3 != (byte *)0x0) {
          if (((ulong)pvVar2 & 3) == 0) {
            pJVar4 = jsonLookup(pParse,(char *)pbVar3,(int *)0x0,ctx);
            bVar9 = pParse->nErr == '\0';
            if (pJVar4 != (JsonNode *)0x0 && bVar9) {
              jsonReturn(pJVar4,ctx,
                         (sqlite3_value **)
                         CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),
                                  pJVar4 != (JsonNode *)0x0 && bVar9));
              return;
            }
          }
          else {
            if (*pbVar3 == 0x24) {
              pJVar4 = jsonLookup(pParse,(char *)pbVar3,(int *)0x0,ctx);
              aReplace = extraout_RDX;
            }
            else {
              pcVar5 = local_b8.zSpace;
              local_b8.nAlloc = 100;
              local_b8.nUsed = 0;
              local_b8.bStatic = '\x01';
              local_b8.bErr = '\0';
              local_b8.zBuf = pcVar5;
              if ((ulong)*pbVar3 - 0x3a < 0xfffffffffffffff6) {
                local_b8.pCtx = ctx;
                jsonAppendRaw(&local_b8,"$.",(*pbVar3 != 0x5b) + 1);
                sVar6 = strlen((char *)pbVar3);
                jsonAppendRaw(&local_b8,(char *)pbVar3,(u32)sVar6);
                jsonAppendChar(&local_b8,'\0');
                aReplace = extraout_RDX_01;
              }
              else {
                local_b8.pCtx = ctx;
                jsonAppendRaw(&local_b8,"$[",2);
                sVar6 = strlen((char *)pbVar3);
                jsonAppendRaw(&local_b8,(char *)pbVar3,(u32)sVar6);
                jsonAppendRaw(&local_b8,"]",2);
                aReplace = extraout_RDX_02;
              }
              if (local_b8.bErr == '\0') {
                pJVar4 = jsonLookup(pParse,local_b8.zBuf,(int *)0x0,ctx);
                aReplace = extraout_RDX_03;
              }
              else {
                pJVar4 = (JsonNode *)0x0;
              }
              if (local_b8.bStatic == '\0') {
                sqlite3_free(local_b8.zBuf);
                aReplace = extraout_RDX_04;
              }
              local_b8.nAlloc = 100;
              local_b8.nUsed = 0;
              local_b8.bStatic = '\x01';
              local_b8.zBuf = pcVar5;
            }
            if (pJVar4 != (JsonNode *)0x0) {
              if (((ulong)pvVar2 & 1) == 0) {
                jsonReturn(pJVar4,ctx,aReplace);
                pMVar1 = ctx->pOut;
                pMVar1->eSubtype = '\0';
                pbVar3 = (byte *)((long)&pMVar1->flags + 1);
                *pbVar3 = *pbVar3 | 8;
              }
              else {
                jsonReturnJson(pJVar4,ctx,(sqlite3_value **)0x0);
              }
            }
          }
        }
      }
      else {
        local_b8.zBuf = local_b8.zSpace;
        local_b8.nAlloc = 100;
        local_b8.nUsed = 0;
        local_b8.bStatic = '\x01';
        local_b8.bErr = '\0';
        local_b8.pCtx = ctx;
        jsonAppendChar(&local_b8,'[');
        uVar7 = 1;
        do {
          pcVar5 = (char *)sqlite3ValueText(argv[uVar7],'\x01');
          pJVar4 = jsonLookup(pParse,pcVar5,(int *)0x0,ctx);
          uVar8 = uVar7;
          if (pParse->nErr != '\0') break;
          if ((local_b8.nUsed != 0) && ((local_b8.zBuf[local_b8.nUsed - 1] & 0xdfU) != 0x5b)) {
            jsonAppendChar(&local_b8,',');
          }
          if (pJVar4 == (JsonNode *)0x0) {
            jsonAppendRaw(&local_b8,"null",4);
          }
          else {
            jsonRenderNode(pJVar4,&local_b8,(sqlite3_value **)0x0);
          }
          uVar7 = uVar7 + 1;
          uVar8 = (ulong)(uint)argc;
        } while ((uint)argc != uVar7);
        if ((int)uVar8 == argc) {
          jsonAppendChar(&local_b8,']');
          if (local_b8.bErr == '\0') {
            sqlite3_result_text64
                      (local_b8.pCtx,local_b8.zBuf,local_b8.nUsed,
                       (_func_void_void_ptr *)
                       (-(ulong)(local_b8.bStatic != '\0') | (ulong)sqlite3_free),'\x01');
            local_b8.nAlloc = 100;
            local_b8.nUsed = 0;
            local_b8.bStatic = '\x01';
            local_b8.zBuf = local_b8.zSpace;
          }
          pMVar1 = ctx->pOut;
          pMVar1->eSubtype = 'J';
          pbVar3 = (byte *)((long)&pMVar1->flags + 1);
          *pbVar3 = *pbVar3 | 8;
        }
        if (local_b8.bStatic == '\0') {
          sqlite3_free(local_b8.zBuf);
        }
      }
    }
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  JsonString jx;

  if( argc<2 ) return;
  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  if( argc==2 ){
    /* With a single PATH argument */
    zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ) return;
    if( flags & JSON_ABPATH ){
      if( zPath[0]!='$' ){
        /* The -> and ->> operators accept abbreviated PATH arguments.  This
        ** is mostly for compatibility with PostgreSQL, but also for
        ** convenience.
        **
        **     NUMBER   ==>  $[NUMBER]     // PG compatible
        **     LABEL    ==>  $.LABEL       // PG compatible
        **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
        */
        jsonInit(&jx, ctx);
        if( sqlite3Isdigit(zPath[0]) ){
          jsonAppendRaw(&jx, "$[", 2);
          jsonAppendRaw(&jx, zPath, (int)strlen(zPath));
          jsonAppendRaw(&jx, "]", 2);
        }else{
          jsonAppendRaw(&jx, "$.", 1 + (zPath[0]!='['));
          jsonAppendRaw(&jx, zPath, (int)strlen(zPath));
          jsonAppendChar(&jx, 0);
        }
        pNode = jx.bErr ? 0 : jsonLookup(p, jx.zBuf, 0, ctx);
        jsonReset(&jx);
      }else{
        pNode = jsonLookup(p, zPath, 0, ctx);
      }
      if( pNode ){
        if( flags & JSON_JSON ){
          jsonReturnJson(pNode, ctx, 0);
        }else{
          jsonReturn(pNode, ctx, 0);
          sqlite3_result_subtype(ctx, 0);
        }
      }
    }else{
      pNode = jsonLookup(p, zPath, 0, ctx);
      if( p->nErr==0 && pNode ) jsonReturn(pNode, ctx, 0);
    }
  }else{
    /* Two or more PATH arguments results in a JSON array with each
    ** element of the array being the value selected by one of the PATHs */
    int i;
    jsonInit(&jx, ctx);
    jsonAppendChar(&jx, '[');
    for(i=1; i<argc; i++){
      zPath = (const char*)sqlite3_value_text(argv[i]);
      pNode = jsonLookup(p, zPath, 0, ctx);
      if( p->nErr ) break;
      jsonAppendSeparator(&jx);
      if( pNode ){
        jsonRenderNode(pNode, &jx, 0);
      }else{
        jsonAppendRaw(&jx, "null", 4);
      }
    }
    if( i==argc ){
      jsonAppendChar(&jx, ']');
      jsonResult(&jx);
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
    jsonReset(&jx);
  }
}